

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O1

void at_plus_a(int n,int_t nz,int_t *colptr,int_t *rowind,int_t *bnz,int_t **b_colptr,
              int_t **b_rowind)

{
  int *piVar1;
  size_t size;
  int iVar2;
  int iVar3;
  void *__s;
  undefined4 *addr;
  void *addr_00;
  ulong uVar4;
  ulong uVar5;
  int_t *piVar6;
  long lVar7;
  undefined4 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  char msg [256];
  char local_138 [264];
  
  lVar11 = (long)n;
  __s = superlu_malloc(lVar11 * 4);
  if (__s == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0x123,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  size = lVar11 * 4 + 4;
  addr = (undefined4 *)superlu_malloc(size);
  if (addr == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_colptr[]",0x125,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_00 = superlu_malloc((long)nz << 2);
  if (addr_00 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails t_rowind[]",0x127,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  uVar10 = (ulong)(uint)n;
  if (0 < n) {
    memset(__s,0,uVar10 * 4);
    uVar5 = 0;
    do {
      lVar7 = (long)colptr[uVar5];
      uVar4 = uVar5 + 1;
      if (colptr[uVar5] < colptr[uVar5 + 1]) {
        do {
          piVar1 = (int *)((long)__s + (long)rowind[lVar7] * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 1;
        } while (lVar7 < colptr[uVar4]);
      }
      uVar5 = uVar4;
    } while (uVar4 != uVar10);
  }
  *addr = 0;
  if (0 < n) {
    uVar5 = 0;
    do {
      addr[uVar5 + 1] = *(int *)((long)__s + uVar5 * 4) + addr[uVar5];
      *(undefined4 *)((long)__s + uVar5 * 4) = addr[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar10 != uVar5);
  }
  if (0 < n) {
    uVar5 = 0;
    do {
      lVar7 = (long)colptr[uVar5];
      uVar4 = uVar5 + 1;
      if (colptr[uVar5] < colptr[uVar5 + 1]) {
        do {
          iVar3 = rowind[lVar7];
          *(int *)((long)addr_00 + (long)*(int *)((long)__s + (long)iVar3 * 4) * 4) = (int)uVar5;
          piVar1 = (int *)((long)__s + (long)iVar3 * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 1;
        } while (lVar7 < colptr[uVar4]);
      }
      uVar5 = uVar4;
    } while (uVar4 != uVar10);
  }
  if (n < 1) {
    iVar3 = 0;
  }
  else {
    memset(__s,0xff,uVar10 * 4);
    iVar3 = 0;
    uVar5 = 0;
    do {
      uVar8 = (undefined4)uVar5;
      *(undefined4 *)((long)__s + uVar5 * 4) = uVar8;
      lVar7 = (long)colptr[uVar5];
      uVar4 = uVar5 + 1;
      if (colptr[uVar5] < colptr[uVar5 + 1]) {
        do {
          if (uVar5 != *(uint *)((long)__s + (long)rowind[lVar7] * 4)) {
            *(undefined4 *)((long)__s + (long)rowind[lVar7] * 4) = uVar8;
            iVar3 = iVar3 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < colptr[uVar4]);
      }
      lVar7 = (long)(int)addr[uVar5];
      if ((int)addr[uVar5] < (int)addr[uVar4]) {
        do {
          lVar9 = (long)*(int *)((long)addr_00 + lVar7 * 4);
          if (uVar5 != *(uint *)((long)__s + lVar9 * 4)) {
            *(undefined4 *)((long)__s + lVar9 * 4) = uVar8;
            iVar3 = iVar3 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)addr[uVar4]);
      }
      uVar5 = uVar4;
    } while (uVar4 != uVar10);
  }
  *bnz = iVar3;
  piVar6 = (int_t *)superlu_malloc(size);
  *b_colptr = piVar6;
  if (piVar6 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_colptr[]",0x166,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  if ((long)*bnz != 0) {
    piVar6 = (int_t *)superlu_malloc((long)*bnz << 2);
    *b_rowind = piVar6;
    if (piVar6 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for b_rowind[]",0x169,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_138);
    }
  }
  if (n < 1) {
    iVar3 = 0;
  }
  else {
    memset(__s,0xff,uVar10 * 4);
    piVar6 = *b_colptr;
    iVar3 = 0;
    uVar5 = 0;
    do {
      piVar6[uVar5] = iVar3;
      uVar8 = (undefined4)uVar5;
      *(undefined4 *)((long)__s + uVar5 * 4) = uVar8;
      lVar7 = (long)colptr[uVar5];
      uVar4 = uVar5 + 1;
      if (colptr[uVar5] < colptr[uVar5 + 1]) {
        do {
          iVar2 = rowind[lVar7];
          if (uVar5 != *(uint *)((long)__s + (long)iVar2 * 4)) {
            *(undefined4 *)((long)__s + (long)iVar2 * 4) = uVar8;
            lVar9 = (long)iVar3;
            iVar3 = iVar3 + 1;
            (*b_rowind)[lVar9] = iVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < colptr[uVar4]);
      }
      lVar7 = (long)(int)addr[uVar5];
      if ((int)addr[uVar5] < (int)addr[uVar4]) {
        do {
          iVar2 = *(int *)((long)addr_00 + lVar7 * 4);
          if (uVar5 != *(uint *)((long)__s + (long)iVar2 * 4)) {
            *(undefined4 *)((long)__s + (long)iVar2 * 4) = uVar8;
            lVar9 = (long)iVar3;
            iVar3 = iVar3 + 1;
            (*b_rowind)[lVar9] = iVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)addr[uVar4]);
      }
      uVar5 = uVar4;
    } while (uVar4 != uVar10);
  }
  (*b_colptr)[lVar11] = iVar3;
  superlu_free(__s);
  superlu_free(addr);
  superlu_free(addr_00);
  return;
}

Assistant:

void at_plus_a(const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
               int_t *bnz, int_t **b_colptr, int_t **b_rowind)
{
    register int_t i, j, k, col, num_nz;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */
    int_t *marker;

    if ( !(marker = (int_t*) SUPERLU_MALLOC( n * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC( nz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < n; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < n; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}


    /* ----------------------------------------------------------------
       compute B = A + T, where column j of B is:

       Struct (B_*j) = Struct (A_*k) UNION Struct (T_*k)

       do not include the diagonal entry
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		++num_nz;
	    }
	}
    }
    *bnz = num_nz;
    
    /* Allocate storage for A+A' */
    if ( !(*b_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_colptr[]");
    if ( *bnz) {
      if ( !(*b_rowind = (int_t*) SUPERLU_MALLOC( *bnz * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for b_rowind[]");
    }
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	(*b_colptr)[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	/* Add pattern of column A_*k to B_*j */
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    k = rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}

	/* Add pattern of column T_*k to B_*j */
	for (i = t_colptr[j]; i < t_colptr[j+1]; ++i) {
	    k = t_rowind[i];
	    if ( marker[k] != j ) {
		marker[k] = j;
		(*b_rowind)[num_nz++] = k;
	    }
	}
    }
    (*b_colptr)[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}